

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O1

Ray * pbrt::SpawnRay(Ray *__return_storage_ptr__,Point3fi pi,Normal3f n,Float time,Vector3f d)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  Point3fi PVar7;
  int iVar8;
  float *pfVar9;
  bool in_CF;
  bool in_ZF;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined8 uVar21;
  undefined8 in_XMM3_Qb;
  float fVar22;
  undefined1 in_register_00001304 [12];
  float fVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float local_c;
  undefined8 local_8;
  
  PVar7.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval> =
       pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>;
  fVar22 = d.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar21 = d.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._4_60_ = n._12_60_;
  auVar20._0_4_ = n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar19._8_56_ = n._8_56_;
  auVar19._0_8_ = n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar17._8_8_ = in_XMM3_Qb;
  auVar17._0_8_ = uVar21;
  auVar14 = vmovshdup_avx(auVar17);
  auVar18 = auVar19._0_16_;
  auVar15 = vmovshdup_avx(auVar18);
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx(auVar12,auVar18);
  auVar16 = vandps_avx(auVar15,auVar12);
  auVar2 = vandps_avx(auVar12,auVar20._0_16_);
  auVar13 = ZEXT416((uint)((pi.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high -
                           pi.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low) * 0.5));
  auVar12 = vmulss_avx512f(auVar2,auVar13);
  auVar13 = vfmsub213ss_avx512f(auVar13,auVar2,auVar12);
  auVar2 = vfmadd213ss_fma(auVar14,auVar15,ZEXT416((uint)(auVar20._0_4_ * fVar22)));
  auVar14._4_12_ = in_register_00001304;
  auVar14._0_4_ = fVar22;
  auVar14 = vfmsub231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar22)),auVar20._0_16_,auVar14);
  auVar14 = vaddss_avx512f(auVar2,auVar14);
  auVar2._8_8_ = in_XMM3_Qb;
  auVar2._0_8_ = uVar21;
  auVar15 = vfmadd231ss_avx512f(auVar14,auVar18,auVar2);
  auVar14 = vucomiss_avx512f(auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_4_ = pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar18._4_4_ = pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  fVar25 = PVar7.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar2 = vmovshdup_avx(auVar18);
  auVar16 = vfmadd213ss_avx512f(ZEXT416((uint)((pi.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high -
                                               auVar2._0_4_) * 0.5)),auVar16,auVar12);
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ + auVar13._0_4_)),auVar17,
                            ZEXT416((uint)((fVar25 - pi.super_Point3<pbrt::Interval>.
                                                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                                                     low) * 0.5)));
  fVar10 = auVar17._0_4_;
  auVar16._0_4_ = fVar10 * n.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar16._4_4_ = fVar10 * n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar16._8_4_ = fVar10 * n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar16._12_4_ = fVar10 * n._12_4_;
  uVar3 = vcmpss_avx512f(auVar15,auVar14,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  fVar10 = (float)((uint)bVar4 * (int)-(fVar10 * auVar20._0_4_) +
                  (uint)!bVar4 * (int)(fVar10 * auVar20._0_4_));
  if (!in_CF && !in_ZF) {
    uVar6 = CONCAT44(auVar16._4_4_,auVar16._0_4_);
    auVar16._0_8_ = uVar6 ^ 0x8000000080000000;
    auVar16._8_4_ = -auVar16._8_4_;
    auVar16._12_4_ = -auVar16._12_4_;
  }
  auVar17 = vinsertps_avx(ZEXT416((uint)pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low),
                          ZEXT416((uint)pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar13._0_4_ = fVar25 + auVar17._0_4_;
  auVar13._4_4_ =
       PVar7.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar17._4_4_;
  auVar13._8_4_ = auVar17._8_4_ + 0.0;
  auVar13._12_4_ = auVar17._12_4_ + 0.0;
  auVar15._8_4_ = 0x3f000000;
  auVar15._0_8_ = 0x3f0000003f000000;
  auVar15._12_4_ = 0x3f000000;
  auVar17 = vmulps_avx512vl(auVar13,auVar15);
  fVar25 = auVar16._0_4_;
  auVar24._0_4_ = auVar17._0_4_ + fVar25;
  auVar24._4_4_ = auVar17._4_4_ + auVar16._4_4_;
  auVar24._8_4_ = auVar17._8_4_ + auVar16._8_4_;
  auVar24._12_4_ = auVar17._12_4_ + auVar16._12_4_;
  pfVar1 = (float *)((long)&local_8 + 4);
  local_8 = vmovlps_avx(auVar24);
  local_c = (pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5
            + fVar10;
  auVar17 = vmovshdup_avx(auVar16);
  iVar8 = 0;
  do {
    fVar11 = fVar25;
    if ((iVar8 != 0) && (fVar11 = auVar17._0_4_, iVar8 != 1)) {
      fVar11 = fVar10;
    }
    fVar23 = auVar14._0_4_;
    if (fVar11 <= fVar23) {
      fVar11 = fVar25;
      if ((iVar8 != 0) && (fVar11 = auVar17._0_4_, iVar8 != 1)) {
        fVar11 = fVar10;
      }
      if (fVar11 < fVar23) {
        pfVar9 = (float *)&local_8;
        if ((iVar8 != 0) && (pfVar9 = pfVar1, iVar8 != 1)) {
          pfVar9 = &local_c;
        }
        fVar11 = *pfVar9;
        if (-INFINITY < fVar11) {
          uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar14,0);
          bVar4 = (bool)((byte)uVar3 & 1);
          fVar11 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar11);
          fVar11 = (float)((int)fVar11 + -1 + (uint)(fVar11 <= fVar23) * 2);
        }
        goto LAB_0027a4aa;
      }
    }
    else {
      pfVar9 = (float *)&local_8;
      if ((iVar8 != 0) && (pfVar9 = pfVar1, iVar8 != 1)) {
        pfVar9 = &local_c;
      }
      fVar11 = *pfVar9;
      if (fVar11 < INFINITY) {
        uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar14,0);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar11 = (float)((uint)bVar4 * (int)fVar23 + (uint)!bVar4 * (int)fVar11);
        fVar11 = (float)((-(uint)(fVar11 < fVar23) | 1) + (int)fVar11);
      }
LAB_0027a4aa:
      pfVar9 = (float *)&local_8;
      if ((iVar8 != 0) && (pfVar9 = pfVar1, iVar8 != 1)) {
        pfVar9 = &local_c;
      }
      *pfVar9 = fVar11;
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == 3) {
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_8;
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y = (float)local_8._4_4_;
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z = local_c;
      auVar5._8_8_ = in_XMM3_Qb;
      auVar5._0_8_ = uVar21;
      uVar3 = vmovlps_avx(auVar5);
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar3 >> 0x20);
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z = fVar22;
      __return_storage_ptr__->time = time;
      (__return_storage_ptr__->medium).
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = 0;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU inline Ray SpawnRay(Point3fi pi, Normal3f n, Float time, Vector3f d) {
    return Ray(OffsetRayOrigin(pi, n, d), d, time);
}